

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O2

DEdgeVec * libDAI::GrowRootedTree(DEdgeVec *__return_storage_ptr__,Graph *T,size_t Root)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  const_iterator __position;
  _Self __tmp;
  Graph Gr;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> treeV;
  DEdge local_a8;
  size_t local_98;
  _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
  local_90;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  local_60;
  
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((T->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_98 = Root;
    std::
    _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
    ::_Rb_tree(&local_90,&T->_M_t);
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&local_60,&local_98);
    while (__position._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left,
          local_90._M_impl.super__Rb_tree_header._M_node_count != 0) {
      while ((_Rb_tree_header *)__position._M_node != &local_90._M_impl.super__Rb_tree_header) {
        p_Var4 = __position._M_node + 1;
        sVar2 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&local_60,(key_type *)p_Var4);
        sVar3 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                count((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&local_60,(key_type *)&__position._M_node[1]._M_parent);
        if (sVar2 == 0) {
          if (sVar3 == 0) {
            __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          }
          else {
            auVar1._0_4_ = p_Var4->_M_color;
            auVar1._4_4_ = *(undefined4 *)&p_Var4->field_0x4;
            auVar1._8_8_ = p_Var4->_M_parent;
            local_a8 = (DEdge)vpermilps_avx(auVar1,0x4e);
            std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::emplace_back<libDAI::DEdge>
                      (__return_storage_ptr__,&local_a8);
            std::
            _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
            ::_M_insert_unique<unsigned_long_const&>
                      ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                        *)&local_60,(unsigned_long *)p_Var4);
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
            std::
            _Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
            ::erase_abi_cxx11_((_Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
                                *)&local_90,__position);
            __position._M_node = p_Var4;
          }
        }
        else {
          local_a8 = *(DEdge *)p_Var4;
          std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::emplace_back<libDAI::DEdge>
                    (__return_storage_ptr__,&local_a8);
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&local_60,(unsigned_long *)&__position._M_node[1]._M_parent);
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
          ::erase_abi_cxx11_((_Rb_tree<libDAI::UEdge,libDAI::UEdge,std::_Identity<libDAI::UEdge>,std::less<libDAI::UEdge>,std::allocator<libDAI::UEdge>>
                              *)&local_90,__position);
          __position._M_node = p_Var4;
        }
      }
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<libDAI::UEdge,_libDAI::UEdge,_std::_Identity<libDAI::UEdge>,_std::less<libDAI::UEdge>,_std::allocator<libDAI::UEdge>_>
    ::~_Rb_tree(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

DEdgeVec GrowRootedTree( const Graph & T, size_t Root ) {
        DEdgeVec result;
        if( T.size() == 0 )
            return result;
        else {
            // Make a copy
            Graph Gr = T;

            // Nodes in the tree
            set<size_t> treeV;

            // Start with the root
            treeV.insert( Root );
            
            // Keep adding edges until done
            while( !(Gr.empty()) )
                for( Graph::iterator e = Gr.begin(); e != Gr.end(); ) {
                    bool e1_in_treeV = treeV.count( e->n1 );
                    bool e2_in_treeV = treeV.count( e->n2 );
                    assert( !(e1_in_treeV && e2_in_treeV) );
                    if( e1_in_treeV ) {
                        // Add directed edge, pointing away from the root
                        result.push_back( DEdge( e->n1, e->n2 ) );
                        treeV.insert( e->n2 );
                        // Erase the edge
                        Gr.erase( e++ );
                    } else if( e2_in_treeV ) {
                        result.push_back( DEdge( e->n2, e->n1 ) );
                        treeV.insert( e->n1 );
                        // Erase the edge
                        Gr.erase( e++ );
                    } else
                        e++;
                }

            return result;
        }
    }